

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O3

void Imf_2_5::anon_unknown_7::readLineOffsets
               (IStream *is,LineOrder lineOrder,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *lineOffsets,bool *complete)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  pointer puVar8;
  ulong uVar9;
  uchar b [8];
  int local_48;
  undefined4 uStack_44;
  LineOrder local_3c;
  undefined8 local_38;
  
  puVar8 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_3c = lineOrder;
  if ((lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish == puVar8) {
    uVar4 = 0;
  }
  else {
    uVar9 = 1;
    uVar7 = 0;
    do {
      uVar6 = uVar9;
      (*is->_vptr_IStream[3])(is,&local_48,8);
      puVar8[uVar7] = CONCAT44(uStack_44,local_48);
      puVar8 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3;
      uVar9 = (ulong)((int)uVar6 + 1);
      uVar7 = uVar6;
    } while (uVar6 < uVar4);
  }
  *complete = true;
  if (uVar4 != 0) {
    uVar9 = 1;
    uVar7 = 0;
    do {
      uVar6 = uVar9;
      if (puVar8[uVar7] == 0) {
        *complete = false;
        iVar2 = (*is->_vptr_IStream[5])(is);
        local_38 = CONCAT44(extraout_var,iVar2);
        if ((lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
            .super__Vector_impl_data._M_finish !=
            (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
            .super__Vector_impl_data._M_start) {
          uVar4 = 0;
          uVar9 = 1;
          do {
            iVar3 = (*is->_vptr_IStream[5])(is);
            (*is->_vptr_IStream[3])(is,&local_48,4);
            (*is->_vptr_IStream[3])(is,&local_48,8);
            iVar2 = local_48;
            (*is->_vptr_IStream[3])(is,&local_48,8);
            Xdr::skip<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,local_48 + iVar2 + 8);
            if (local_3c == INCREASING_Y) {
              puVar8 = (lineOffsets->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              puVar8[uVar4] = CONCAT44(extraout_var_00,iVar3);
              lVar5 = (long)(lineOffsets->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar8;
            }
            else {
              puVar8 = (lineOffsets->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
              lVar5 = (long)puVar8 -
                      (long)(lineOffsets->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start;
              puVar8[~uVar4] = CONCAT44(extraout_var_00,iVar3);
            }
            bVar1 = uVar9 < (ulong)(lVar5 >> 3);
            uVar4 = uVar9;
            uVar9 = (ulong)((int)uVar9 + 1);
          } while (bVar1);
        }
        (*is->_vptr_IStream[7])(is);
        (*is->_vptr_IStream[6])(is,local_38);
        return;
      }
      uVar9 = (ulong)((int)uVar6 + 1);
      uVar7 = uVar6;
    } while (uVar6 < uVar4);
  }
  return;
}

Assistant:

void
readLineOffsets (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is,
                 LineOrder lineOrder,
                 vector<Int64> &lineOffsets,
                 bool &complete)
{
    for (unsigned int i = 0; i < lineOffsets.size(); i++)
    {
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, lineOffsets[i]);
    }

    complete = true;

    for (unsigned int i = 0; i < lineOffsets.size(); i++)
    {
        if (lineOffsets[i] <= 0)
        {
            //
            // Invalid data in the line offset table mean that
            // the file is probably incomplete (the table is
            // the last thing written to the file).  Either
            // some process is still busy writing the file,
            // or writing the file was aborted.
            //
            // We should still be able to read the existing
            // parts of the file.  In order to do this, we
            // have to make a sequential scan over the scan
            // line data to reconstruct the line offset table.
            //

            complete = false;
            reconstructLineOffsets (is, lineOrder, lineOffsets);
            break;
        }
    }
}